

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void QPDF::registerStreamFilter
               (string *filter_name,function<std::shared_ptr<QPDFStreamFilter>_()> *factory)

{
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<std::shared_ptr<QPDFStreamFilter>_()>::function
            ((function<std::shared_ptr<QPDFStreamFilter>_()> *)&local_30,factory);
  ::qpdf::Stream::registerStreamFilter
            (filter_name,(function<std::shared_ptr<QPDFStreamFilter>_()> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void
QPDF::registerStreamFilter(
    std::string const& filter_name, std::function<std::shared_ptr<QPDFStreamFilter>()> factory)
{
    qpdf::Stream::registerStreamFilter(filter_name, factory);
}